

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiItemStatusFlags *pIVar1;
  int *piVar2;
  short *psVar3;
  float fVar4;
  ImGuiID IVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  ImVec2 IVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  bool bVar15;
  bool bVar16;
  ImGuiNavItemData *pIVar17;
  float fVar18;
  float fVar19;
  ImRect IVar20;
  ImRect nav_bb;
  
  pIVar12 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar11 = bb->Max;
  (pIVar12->LastItemData).Rect.Min = bb->Min;
  (pIVar12->LastItemData).Rect.Max = IVar11;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar11 = nav_bb_arg->Max;
  (pIVar12->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar12->LastItemData).NavRect.Max = IVar11;
  (pIVar12->LastItemData).InFlags = extra_flags | pIVar12->CurrentItemFlags;
  (pIVar12->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_0013181a;
  KeepAliveID(id);
  psVar3 = &(pIVar9->DC).NavLayersActiveMaskNext;
  *psVar3 = *psVar3 | (ushort)(1 << ((char)(pIVar9->DC).NavLayerCurrent & 0x1f));
  pIVar13 = GImGui;
  if ((((pIVar12->NavId == id) || (pIVar12->NavAnyRequest == true)) &&
      (pIVar10 = pIVar12->NavWindow, pIVar10->RootWindowForNav == pIVar9->RootWindowForNav)) &&
     ((pIVar9 == pIVar10 || (((uint)(pIVar10->Flags | pIVar9->Flags) >> 0x17 & 1) != 0)))) {
    pIVar10 = GImGui->CurrentWindow;
    IVar5 = (GImGui->LastItemData).ID;
    nav_bb.Min = (GImGui->LastItemData).NavRect.Min;
    nav_bb.Max = (GImGui->LastItemData).NavRect.Max;
    uVar6 = (GImGui->LastItemData).InFlags;
    if ((GImGui->NavInitRequest == true) &&
       ((uVar6 & 4) == 0 && GImGui->NavLayer == (pIVar10->DC).NavLayerCurrent)) {
      if ((uVar6 & 0x10) == 0) {
        GImGui->NavInitResultId = IVar5;
        IVar20 = WindowRectAbsToRel(pIVar10,&nav_bb);
        pIVar13->NavInitResultRectRel = IVar20;
        pIVar13->NavInitRequest = false;
        NavUpdateAnyRequestFlag();
      }
      else if (GImGui->NavInitResultId == 0) {
        GImGui->NavInitResultId = IVar5;
        IVar20 = WindowRectAbsToRel(pIVar10,&nav_bb);
        pIVar13->NavInitResultRectRel = IVar20;
      }
    }
    pIVar14 = GImGui;
    if (pIVar13->NavMoveScoringItems == true) {
      uVar7 = pIVar13->NavMoveFlags;
      if ((uVar7 >> 10 & 1) == 0) {
        if ((uVar6 & 0xc) == 0 && ((uVar7 & 0x10) != 0 || pIVar13->NavId != IVar5)) {
          pIVar17 = &pIVar13->NavMoveResultOther;
          if (pIVar10 == pIVar13->NavWindow) {
            pIVar17 = &pIVar13->NavMoveResultLocal;
          }
          bVar15 = NavScoreItem(pIVar17);
          if (bVar15) {
            NavApplyItemToResult(pIVar17);
          }
          if (((pIVar13->NavMoveFlags & 0x20) != 0) &&
             (bVar15 = ImRect::Overlaps(&pIVar10->ClipRect,&nav_bb), bVar15)) {
            fVar4 = (pIVar10->ClipRect).Min.y;
            fVar18 = (pIVar10->ClipRect).Max.y;
            fVar19 = fVar18;
            if (nav_bb.Max.y <= fVar18) {
              fVar19 = nav_bb.Max.y;
            }
            if (nav_bb.Min.y <= fVar18) {
              fVar18 = nav_bb.Min.y;
            }
            if ((nav_bb.Max.y - nav_bb.Min.y) * 0.7 <=
                (float)(-(uint)(nav_bb.Max.y < fVar4) & (uint)fVar4 |
                       ~-(uint)(nav_bb.Max.y < fVar4) & (uint)fVar19) -
                (float)(-(uint)(nav_bb.Min.y < fVar4) & (uint)fVar4 |
                       ~-(uint)(nav_bb.Min.y < fVar4) & (uint)fVar18)) {
              bVar15 = NavScoreItem(&pIVar13->NavMoveResultLocalVisible);
              if (bVar15) {
                NavApplyItemToResult(&pIVar13->NavMoveResultLocalVisible);
              }
            }
          }
        }
      }
      else if ((uVar6 & 0x105) == 0x100 || (uVar7 >> 9 & 1) != 0) {
        pIVar17 = &GImGui->NavMoveResultLocal;
        iVar8 = GImGui->NavTabbingDir;
        if (iVar8 == -1) {
          if (GImGui->NavId == IVar5) {
            if ((GImGui->NavMoveResultLocal).ID != 0) {
              GImGui->NavMoveScoringItems = false;
              NavUpdateAnyRequestFlag();
            }
          }
          else {
            NavApplyItemToResult(pIVar17);
          }
        }
        else if (iVar8 == 0) {
          if ((GImGui->NavTabbingResultFirst).ID == 0) {
            pIVar17 = &GImGui->NavTabbingResultFirst;
LAB_00131b7a:
            NavMoveRequestResolveWithLastItem(pIVar17);
          }
        }
        else if (iVar8 == 1) {
          if ((GImGui->NavTabbingResultFirst).ID == 0) {
            NavApplyItemToResult(&GImGui->NavTabbingResultFirst);
          }
          piVar2 = &pIVar14->NavTabbingCounter;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) goto LAB_00131b7a;
          if (pIVar14->NavId == IVar5) {
            pIVar14->NavTabbingCounter = 1;
          }
        }
      }
    }
    if (pIVar13->NavId == IVar5) {
      if (pIVar13->NavWindow != pIVar10) {
        SetNavWindow(pIVar10);
      }
      pIVar13->NavLayer = (pIVar10->DC).NavLayerCurrent;
      pIVar13->NavFocusScopeId = (pIVar10->DC).NavFocusScopeIdCurrent;
      pIVar13->NavIdIsAlive = true;
      IVar20 = WindowRectAbsToRel(pIVar10,&nav_bb);
      pIVar10->NavRectRel[(pIVar10->DC).NavLayerCurrent] = IVar20;
    }
  }
  if (pIVar9->ID == id) {
    __assert_fail("id != window->ID && \"Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x209b,
                  "bool ImGui::ItemAdd(const ImRect &, ImGuiID, const ImRect *, ImGuiItemFlags)");
  }
LAB_0013181a:
  (pIVar12->NextItemData).Flags = 0;
  bVar15 = IsClippedEx(bb,id);
  if ((!bVar15) && (bVar16 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar16)) {
    pIVar1 = &(pIVar12->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
  }
  return !bVar15;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}